

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_tree.cpp
# Opt level: O2

uchar __thiscall node_t::first_byte_at(node_t *this,size_t index_)

{
  uchar *puVar1;
  
  puVar1 = this->_data;
  if (*(uint *)(puVar1 + 8) <= index_) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","index_ < edgecount ()",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/radix_tree.cpp"
            ,0x66);
    fflush(_stderr);
    zmq::zmq_abort("index_ < edgecount ()");
    puVar1 = this->_data;
  }
  return puVar1[index_ + 0xc + (ulong)*(uint *)(puVar1 + 4)];
}

Assistant:

unsigned char node_t::first_byte_at (size_t index_)
{
    zmq_assert (index_ < edgecount ());
    return first_bytes ()[index_];
}